

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::unmap_range<long>(Omega_h *this,LO begin,LO end,Read<signed_char> *b_data,Int width)

{
  int size_in;
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Write<long> local_a8;
  undefined1 local_98 [8];
  type f;
  allocator local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  Write<signed_char> a_data;
  LO na;
  Int width_local;
  Read<signed_char> *b_data_local;
  LO end_local;
  LO begin_local;
  
  a_data.shared_alloc_.direct_ptr._4_4_ = width;
  if (begin <= end) {
    a_data.shared_alloc_.direct_ptr._0_4_ = end - begin;
    size_in = (int)a_data.shared_alloc_.direct_ptr * width;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"",&local_59);
    Write<long>::Write((Write<long> *)local_38,size_in,(string *)local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_98._4_4_ = a_data.shared_alloc_.direct_ptr._4_4_;
    local_98._0_4_ = begin;
    Write<long>::Write((Write<long> *)&f,(Write<int> *)local_38);
    Read<long>::Read((Read<long> *)&f.a_data.shared_alloc_.direct_ptr,(Read<int> *)b_data);
    parallel_for<Omega_h::unmap_range<long>(int,int,Omega_h::Read<long>,int)::_lambda(int)_1_>
              ((int)a_data.shared_alloc_.direct_ptr,(type *)local_98,"unmap_range");
    Write<long>::Write(&local_a8,(Write<int> *)local_38);
    Read<long>::Read((Read<long> *)this,&local_a8);
    Write<long>::~Write(&local_a8);
    unmap_range<long>(int,int,Omega_h::Read<long>,int)::{lambda(int)#1}::~Read
              ((_lambda_int__1_ *)local_98);
    Write<long>::~Write((Write<long> *)local_38);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","begin <= end",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x5b);
}

Assistant:

Read<T> unmap_range(LO begin, LO end, Read<T> b_data, Int width) {
  OMEGA_H_CHECK(begin <= end);
  auto na = end - begin;
  Write<T> a_data(na * width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a + begin;
    for (Int j = 0; j < width; ++j) {
      a_data[a * width + j] = b_data[b * width + j];
    }
  };
  parallel_for(na, f, "unmap_range");
  return a_data;
}